

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O1

GLsizei getNumberOfTriangles(DelaunayTriangulation *delTri)

{
  Edge *pEVar1;
  void *__ptr;
  ulong uVar2;
  int iVar3;
  GLsizei GVar4;
  Edge *pEVar5;
  size_t __nmemb;
  
  GVar4 = 0;
  if ((2 < delTri->n_points) && (GVar4 = 0, delTri->success != 0)) {
    __nmemb = (size_t)delTri->n_edges;
    __ptr = calloc(__nmemb,1);
    if ((long)__nmemb < 1) {
      GVar4 = -1;
    }
    else {
      pEVar1 = delTri->edges;
      uVar2 = 0;
      iVar3 = 0;
      do {
        if ((pEVar1[uVar2].discarded == 0) && (*(char *)((long)__ptr + uVar2) == '\0')) {
          pEVar5 = pEVar1 + uVar2;
          do {
            *(undefined1 *)((long)__ptr + (long)pEVar5->idx) = 1;
            pEVar5 = pEVar5->onext->sym;
          } while (uVar2 != (uint)pEVar5->idx);
          iVar3 = iVar3 + 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != __nmemb);
      GVar4 = iVar3 + -1;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return GVar4;
}

Assistant:

GLsizei getNumberOfTriangles(DelaunayTriangulation *delTri) {
	if ((delTri->n_points < 3) || (!delTri->success)) {
		return 0;
	}
	char *visited_edges = calloc(delTri->n_edges, sizeof(char));
	GLsizei n_triangles = 0;
	Edge *e;

	for (GLsizei i = 0; i < delTri->n_edges; i++) {
		e = &(delTri->edges[i]);
		if ((!e->discarded) && (visited_edges[i] == 0)) {
			do {
				visited_edges[e->idx] = 1;
				e = e->onext->sym;
			} while (e->idx != i);
			n_triangles ++;
		}
	}

	if (visited_edges != NULL) free(visited_edges);

	return n_triangles - 1; // Remove the "outside"

}